

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Cnf_Dat_t * Mf_ManDeriveCnf(Mf_Man_t *p,int fCnfObjIds,int fAddOrCla)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  undefined8 uVar6;
  void *pvVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  bool bVar10;
  uint uVar11;
  int *__s;
  Cnf_Dat_t *pCVar12;
  int **ppiVar13;
  int *piVar14;
  int *piVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  size_t __size;
  char *pcVar25;
  uint uVar26;
  long lVar27;
  char *pcVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  int nLits;
  int nClas;
  int nVars;
  int pFanins [16];
  Aig_Obj_t *local_c8;
  int local_ac;
  int local_a8;
  int local_a4;
  Cnf_Dat_t *local_a0;
  Vec_Int_t *local_98;
  long local_90;
  long local_88;
  ulong local_80;
  int aiStack_78 [18];
  
  local_98 = Mf_ManDeriveCnfs(p,&local_a4,&local_a8,&local_ac);
  pGVar3 = p->pGia;
  uVar18 = pGVar3->nObjs;
  uVar33 = (ulong)uVar18;
  lVar34 = (long)(int)uVar18;
  uVar26 = 0x10;
  if (0xe < uVar18 - 1) {
    uVar26 = uVar18;
  }
  if (uVar26 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar26 << 2);
  }
  memset(__s,0xff,lVar34 * 4);
  iVar1 = local_a4 + 1;
  if (fAddOrCla != 0) {
    local_a8 = local_a8 + 1;
    local_ac = local_ac + *(int *)((long)&((Aig_Obj_t *)pGVar3->vCos)->field_0 + 4);
  }
  if (fCnfObjIds == 0) {
    local_c8 = (Aig_Obj_t *)pGVar3->vCos;
    if (*(int *)((long)&local_c8->field_0 + 4) < 1) {
      iVar17 = 1;
    }
    else {
      pAVar4 = local_c8->pFanin0;
      lVar27 = 0;
      do {
        iVar17 = *(int *)((long)&pAVar4->field_0 + lVar27 * 4);
        if (((long)iVar17 < 0) || ((int)uVar18 <= iVar17)) goto LAB_0071e21e;
        if (iVar17 == 0) break;
        lVar27 = lVar27 + 1;
        __s[iVar17] = (int)lVar27;
      } while (lVar27 < *(int *)((long)&local_c8->field_0 + 4));
      iVar17 = (int)lVar27 + 1;
    }
    if (1 < (int)uVar18) {
      lVar22 = uVar33 << 4;
      uVar19 = uVar33;
      lVar27 = uVar33 * 3;
      do {
        if (lVar34 < (long)uVar19) goto LAB_0071e21e;
        uVar26 = *(uint *)((long)pGVar3->pObjs + lVar27 * 4 + -0xc);
        if (((~uVar26 & 0x1fffffff) != 0 && -1 < (int)uVar26) &&
           (0xffff < *(uint *)((long)p->pLfObjs + lVar22 + -4))) {
          __s[uVar19 - 1] = iVar17;
          iVar17 = iVar17 + 1;
        }
        lVar22 = lVar22 + -0x10;
        bVar10 = 2 < uVar19;
        uVar19 = uVar19 - 1;
        lVar27 = lVar27 + -3;
      } while (bVar10);
    }
    if ((int)uVar18 < 1) goto LAB_0071e2ea;
    *__s = iVar17;
    pAVar4 = (Aig_Obj_t *)pGVar3->vCis;
    if (0 < *(int *)((long)&pAVar4->field_0 + 4)) {
      pAVar5 = pAVar4->pFanin0;
      lVar34 = 0;
      do {
        uVar26 = *(uint *)((long)&pAVar5->field_0 + lVar34 * 4);
        if (((long)(int)uVar26 < 0) || (uVar18 <= uVar26)) goto LAB_0071e21e;
        if (uVar26 == 0) break;
        __s[(int)uVar26] = iVar17 + (int)lVar34 + 1;
        lVar34 = lVar34 + 1;
      } while (lVar34 < *(int *)((long)&pAVar4->field_0 + 4));
      iVar17 = iVar17 + (int)lVar34;
    }
    if (iVar17 != local_a4) {
      local_a4 = iVar1;
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x16c,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  else {
    pAVar4 = (Aig_Obj_t *)pGVar3->vCis;
    local_c8 = (Aig_Obj_t *)pGVar3->vCos;
    iVar17 = *(int *)((long)&pAVar4->field_0 + 4);
    iVar21 = *(int *)((long)&local_c8->field_0 + 4);
    if (0 < iVar21) {
      pAVar5 = local_c8->pFanin0;
      lVar27 = 0;
      do {
        iVar2 = *(int *)((long)&pAVar5->field_0 + lVar27 * 4);
        if (((long)iVar2 < 0) || ((int)uVar18 <= iVar2)) goto LAB_0071e21e;
        if (iVar2 == 0) break;
        __s[iVar2] = iVar2;
        lVar27 = lVar27 + 1;
      } while (lVar27 < *(int *)((long)&local_c8->field_0 + 4));
    }
    iVar17 = iVar17 + iVar21 + 2;
    if (1 < (int)uVar18) {
      lVar22 = uVar33 << 4;
      uVar19 = uVar33;
      lVar27 = uVar33 * 3;
      do {
        if (lVar34 < (long)uVar19) goto LAB_0071e21e;
        uVar26 = *(uint *)((long)pGVar3->pObjs + lVar27 * 4 + -0xc);
        if (((~uVar26 & 0x1fffffff) != 0 && -1 < (int)uVar26) &&
           (0xffff < *(uint *)((long)p->pLfObjs + lVar22 + -4))) {
          __s[uVar19 - 1] = (int)uVar19 + -1;
          iVar17 = iVar17 + 1;
        }
        lVar22 = lVar22 + -0x10;
        bVar10 = 2 < uVar19;
        uVar19 = uVar19 - 1;
        lVar27 = lVar27 + -3;
      } while (bVar10);
    }
    if ((int)uVar18 < 1) {
LAB_0071e2ea:
      local_a4 = iVar1;
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *__s = 0;
    if (0 < *(int *)((long)&pAVar4->field_0 + 4)) {
      pAVar5 = pAVar4->pFanin0;
      lVar34 = 0;
      do {
        uVar26 = *(uint *)((long)&pAVar5->field_0 + lVar34 * 4);
        if (((long)(int)uVar26 < 0) || (uVar18 <= uVar26)) goto LAB_0071e21e;
        if (uVar26 == 0) break;
        __s[(int)uVar26] = uVar26;
        lVar34 = lVar34 + 1;
      } while (lVar34 < *(int *)((long)&pAVar4->field_0 + 4));
    }
    if (iVar17 != iVar1) {
      local_a4 = iVar1;
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x160,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  local_a4 = iVar1;
  pCVar12 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar12->pMan = (Aig_Man_t *)pGVar3;
  pCVar12->nVars = iVar1;
  lVar34 = (long)local_ac;
  pCVar12->nLiterals = local_ac;
  local_90 = (long)local_a8;
  pCVar12->nClauses = local_a8;
  ppiVar13 = (int **)malloc(local_90 * 8 + 8);
  pCVar12->pClauses = ppiVar13;
  local_a0 = pCVar12;
  local_88 = lVar34;
  piVar14 = (int *)malloc(lVar34 * 4);
  pVVar9 = local_98;
  *ppiVar13 = piVar14;
  uVar26 = *(uint *)((long)&local_c8->field_0 + 4);
  uVar19 = (ulong)uVar26;
  iVar1 = local_a4;
  if (fAddOrCla == 0) {
    uVar23 = 0;
    lVar34 = 0;
  }
  else {
    if ((int)uVar26 < 1) {
      lVar27 = 1;
      uVar23 = 0;
      goto LAB_0071dd7a;
    }
    pAVar4 = local_c8->pFanin0;
    uVar23 = 0;
    do {
      uVar26 = (uint)uVar19;
      uVar11 = *(uint *)((long)&pAVar4->field_0 + uVar23 * 4);
      if (((long)(int)uVar11 < 0) || (uVar18 <= uVar11)) goto LAB_0071e21e;
      if (uVar11 == 0) break;
      if (__s[(int)uVar11] < 0) goto LAB_0071e1ff;
      piVar14[uVar23] = __s[(int)uVar11] * 2;
      uVar23 = uVar23 + 1;
      uVar26 = *(uint *)((long)&local_c8->field_0 + 4);
      uVar19 = (ulong)(int)uVar26;
    } while ((long)uVar23 < (long)uVar19);
    lVar34 = 1;
  }
  lVar27 = lVar34;
  if (0 < (int)uVar26) {
    uVar23 = uVar23 & 0xffffffff;
    lVar29 = 0;
    lVar22 = 0;
    lVar30 = 0;
    do {
      iVar17 = *(int *)((long)&local_c8->pFanin0->field_0 + lVar22);
      lVar32 = (long)iVar17;
      if ((lVar32 < 0) || (uVar18 = pGVar3->nObjs, (int)uVar18 <= iVar17)) goto LAB_0071e21e;
      if ((Vec_Ptr_t *)pGVar3->pObjs == (Vec_Ptr_t *)0x0) goto LAB_0071dd64;
      piVar15 = &((Vec_Ptr_t *)pGVar3->pObjs)->nCap + lVar32 * 3;
      uVar6 = *(undefined8 *)piVar15;
      *(ulong *)((long)ppiVar13 + lVar22 * 4 + lVar34 * 8) = (long)piVar14 + lVar29 + uVar23 * 4;
      if (__s[lVar32] < 0) goto LAB_0071e1ff;
      iVar17 = iVar17 - ((uint)uVar6 & 0x1fffffff);
      piVar14 = *ppiVar13;
      piVar14[uVar23 + lVar22] = __s[lVar32] * 2;
      if (__s[iVar17] < 0) goto LAB_0071e1ff;
      piVar14[uVar23 + lVar22 + 1] = ((uint)*piVar15 >> 0x1d & 1) + __s[iVar17] * 2 ^ 1;
      *(ulong *)((long)ppiVar13 + lVar22 * 4 + lVar34 * 8 + 8) =
           (long)piVar14 + lVar29 + uVar23 * 4 + 8;
      if (__s[lVar32] < 0) goto LAB_0071e1ff;
      piVar14[uVar23 + lVar22 + 2] = __s[lVar32] * 2 + 1;
      if (__s[iVar17] < 0) goto LAB_0071e1ff;
      piVar14[uVar23 + lVar22 + 3] = ((uint)*piVar15 >> 0x1d & 1) + __s[iVar17] * 2;
      lVar30 = lVar30 + 1;
      lVar22 = lVar22 + 4;
      lVar29 = lVar29 + 0x10;
      lVar27 = lVar27 + 2;
    } while (lVar30 < *(int *)((long)&local_c8->field_0 + 4));
    uVar18 = pGVar3->nObjs;
LAB_0071dd64:
    uVar33 = (ulong)uVar18;
    uVar23 = uVar23 + lVar22;
  }
LAB_0071dd7a:
  iVar21 = (int)lVar27;
  iVar17 = (int)uVar23;
  if (1 < (int)uVar33) {
    do {
      if ((long)pGVar3->nObjs < (long)uVar33) goto LAB_0071e21e;
      uVar19 = uVar33 - 1;
      uVar18 = *(uint *)((long)pGVar3->pObjs + uVar19 * 0xc);
      if (((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) &&
         (0xffff < *(uint *)&p->pLfObjs[uVar19].field_0xc)) {
        uVar18 = p->pLfObjs[uVar19].iCutSet;
        uVar26 = (int)uVar18 >> 0x10;
        if (((int)uVar26 < 0) || ((p->vPages).nSize <= (int)uVar26)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = (p->vPages).pArray[uVar26];
        uVar31 = (ulong)(uVar18 & 0xffff);
        uVar18 = *(uint *)((long)pvVar7 + uVar31 * 4 + 4);
        uVar26 = uVar18 & 0x1f;
        if (uVar26 == 0) {
          uVar24 = 0;
        }
        else {
          uVar24 = 0;
          do {
            aiStack_78[uVar24] = __s[*(int *)((long)pvVar7 + uVar24 * 4 + uVar31 * 4 + 8)];
            uVar24 = uVar24 + 1;
          } while (uVar26 != uVar24);
          uVar24 = (ulong)uVar26;
        }
        aiStack_78[uVar24] = __s[uVar19];
        if (local_98->nSize <= (int)(uVar18 >> 6)) goto LAB_0071e27b;
        piVar15 = local_98->pArray;
        lVar34 = (long)piVar15[uVar18 >> 6];
        if ((lVar34 < 0) || (local_98->nSize <= piVar15[uVar18 >> 6])) {
          pcVar28 = "i >= 0 && i < p->nSize";
          pcVar25 = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          pcVar20 = "int *Vec_IntEntryP(Vec_Int_t *, int)";
          goto LAB_0071e233;
        }
        iVar17 = piVar15[lVar34];
        if (0 < (long)iVar17) {
          uVar26 = uVar18 >> 5;
          lVar27 = (long)(int)lVar27;
          lVar22 = 0;
          do {
            iVar21 = (int)uVar23;
            ppiVar13[lVar27] = piVar14 + iVar21;
            uVar11 = piVar15[lVar34 + lVar22 + 1] >> ((char)(uVar18 & 0x1f) * '\x02' & 0x1fU) & 3;
            local_80 = uVar19;
            if (uVar11 == 0) {
              pcVar28 = "Mf_CubeLit(pCubes[c], k)";
              pcVar25 = 
              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
              ;
              pcVar20 = "Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)";
              goto LAB_0071e252;
            }
            if (aiStack_78[uVar18 & 0x1f] < 0) goto LAB_0071e1ff;
            piVar14 = *ppiVar13;
            uVar23 = (ulong)(iVar21 + 1);
            piVar14[iVar21] = ((uint)(uVar11 == 2) ^ uVar26 & 1) + aiStack_78[uVar18 & 0x1f] * 2;
            uVar18 = *(uint *)((long)pvVar7 + uVar31 * 4 + 4);
            if ((uVar18 & 0x1f) != 0) {
              bVar16 = 0;
              uVar24 = 0;
              do {
                uVar11 = piVar15[lVar34 + lVar22 + 1] >> (bVar16 & 0x1f) & 3;
                if (uVar11 != 0) {
                  if (aiStack_78[uVar24] < 0) goto LAB_0071e1ff;
                  iVar21 = (int)uVar23;
                  uVar23 = (ulong)(iVar21 + 1);
                  piVar14[iVar21] = (uint)(uVar11 == 2) + aiStack_78[uVar24] * 2;
                  uVar18 = *(uint *)((long)pvVar7 + uVar31 * 4 + 4);
                }
                uVar24 = uVar24 + 1;
                bVar16 = bVar16 + 2;
              } while (uVar24 < (uVar18 & 0x1f));
            }
            lVar27 = lVar27 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != iVar17);
        }
      }
      iVar21 = (int)lVar27;
      iVar17 = (int)uVar23;
      bVar10 = 2 < (long)uVar33;
      uVar33 = uVar19;
    } while (bVar10);
  }
  ppiVar13[iVar21] = piVar14 + iVar17;
  if (*__s < 0) {
LAB_0071e1ff:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  piVar14 = *ppiVar13;
  piVar14[iVar17] = *__s * 2 + 1;
  if (iVar21 + 1 != (int)local_90) {
    __assert_fail("iCla == nClas",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a8,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  if (iVar17 + 1 != (int)local_88) {
    __assert_fail("iLit == nLits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a9,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  ppiVar13[local_90] = piVar14 + local_88;
  if (local_98->pArray != (int *)0x0) {
    free(local_98->pArray);
  }
  free(pVVar9);
  pGVar3 = p->pGia;
  if (fCnfObjIds == 0) {
    pGVar8 = p->pGia0;
    if (pGVar3 == pGVar8) {
      local_a0->pVarNums = __s;
      return local_a0;
    }
    iVar17 = pGVar8->nObjs;
    piVar14 = (int *)malloc((long)iVar17 << 2);
    memset(piVar14,0xff,(long)iVar17 << 2);
    local_a0->pVarNums = piVar14;
    pVVar9 = pGVar8->vCis;
    iVar1 = local_a4;
    if (0 < pVVar9->nSize) {
      piVar15 = pVVar9->pArray;
      lVar34 = 0;
      do {
        iVar21 = piVar15[lVar34];
        if (((long)iVar21 < 0) || (iVar17 <= iVar21)) goto LAB_0071e21e;
        if (iVar21 == 0) break;
        if (pGVar3->vCis->nSize <= lVar34) goto LAB_0071e27b;
        iVar2 = pGVar3->vCis->pArray[lVar34];
        if (((long)iVar2 < 0) || (pGVar3->nObjs <= iVar2)) goto LAB_0071e21e;
        piVar14[iVar21] = __s[iVar2];
        lVar34 = lVar34 + 1;
      } while (lVar34 < pVVar9->nSize);
    }
    pVVar9 = pGVar8->vCos;
    pCVar12 = local_a0;
    if (0 < pVVar9->nSize) {
      piVar15 = pVVar9->pArray;
      lVar34 = 0;
LAB_0071e18e:
      iVar21 = piVar15[lVar34];
      if (((long)iVar21 < 0) || (iVar17 <= iVar21)) {
LAB_0071e21e:
        local_a4 = iVar1;
        pcVar28 = "v >= 0 && v < p->nObjs";
        pcVar25 = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        pcVar20 = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_0071e233:
        __assert_fail(pcVar28,pcVar25,0x1af,pcVar20);
      }
      if (iVar21 != 0) {
        if (pGVar3->vCos->nSize <= lVar34) {
LAB_0071e27b:
          pcVar28 = "i >= 0 && i < p->nSize";
          pcVar25 = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          pcVar20 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_0071e252:
          __assert_fail(pcVar28,pcVar25,0x19e,pcVar20);
        }
        iVar2 = pGVar3->vCos->pArray[lVar34];
        if (((long)iVar2 < 0) || (pGVar3->nObjs <= iVar2)) goto LAB_0071e21e;
        piVar14[iVar21] = __s[iVar2];
        lVar34 = lVar34 + 1;
        if (lVar34 < pVVar9->nSize) goto LAB_0071e18e;
      }
    }
  }
  else {
    __size = (long)pGVar3->nObjs << 2;
    piVar14 = (int *)malloc(__size);
    memset(piVar14,0xff,__size);
    pCVar12 = local_a0;
    local_a0->pObj2Clause = piVar14;
    piVar15 = (int *)malloc(__size);
    memset(piVar15,0xff,__size);
    pCVar12->pObj2Count = piVar15;
    if (0 < (int)local_90) {
      lVar34 = 0;
      do {
        if (*ppiVar13[lVar34] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar18 = (uint)*ppiVar13[lVar34] >> 1;
        if (piVar14[uVar18] == -1) {
          piVar14[uVar18] = (int)lVar34;
          piVar15[uVar18] = 1;
        }
        else {
          if (piVar15[uVar18] < 1) {
            __assert_fail("pCnf->pObj2Count[Id] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                          ,0x1bd,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
          }
          piVar15[uVar18] = piVar15[uVar18] + 1;
        }
        lVar34 = lVar34 + 1;
      } while (local_90 != lVar34);
    }
  }
  free(__s);
  return pCVar12;
}

Assistant:

Cnf_Dat_t * Mf_ManDeriveCnf( Mf_Man_t * p, int fCnfObjIds, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int Id, DriId, nVars, nClas, nLits, iVar = 1, iCla = 0, iLit = 0;
    Vec_Int_t * vCnfs = Mf_ManDeriveCnfs( p, &nVars, &nClas, &nLits );
    Vec_Int_t * vCnfIds = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    int pFanins[16], * pCut, * pCnfIds = Vec_IntArray( vCnfIds );
    int i, k, c, iFunc, nCubes, * pCubes, fComplLast;
    nVars++;  // zero-ID to remain unused
    if ( fAddOrCla )
    {
        nClas++;
        nLits += Gia_ManCoNum(p->pGia);
    }
    // create CNF IDs
    if ( fCnfObjIds )
    {
        iVar += 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, Id ), iVar++;
        Vec_IntWriteEntry( vCnfIds, 0, 0 );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        assert( iVar == nVars );
    }
    else
    {
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Vec_IntWriteEntry( vCnfIds, 0, iVar++ );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        assert( iVar == nVars );
    }
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan        = (Aig_Man_t *)p->pGia;
    pCnf->nVars       = nVars;
    pCnf->nLiterals   = nLits;
    pCnf->nClauses    = nClas;
    pCnf->pClauses    = ABC_ALLOC( int *, nClas+1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLits );
    // add last clause
    if ( fAddOrCla )
    {
        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        Gia_ManForEachCoId( p->pGia, Id, i )
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
    }
    // add clauses for the COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Id = Gia_ObjId( p->pGia, pObj );
        DriId = Gia_ObjFaninId0( pObj, Id );

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], !Gia_ObjFaninC0(pObj));

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 1);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], Gia_ObjFaninC0(pObj));
    }
    // add clauses for the mapping
    Gia_ManForEachAndReverseId( p->pGia, Id )
    {
        if ( !Mf_ObjMapRefNum(p, Id) )
            continue;
        pCut = Mf_ObjCutBest( p, Id );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        //Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, iFunc), 3 );
        fComplLast = Abc_LitIsCompl( Mf_CutFunc(pCut) );
        for ( k = 0; k < Mf_CutSize(pCut); k++ )
            pFanins[k] = pCnfIds[pCut[k+1]];
        pFanins[k++] = pCnfIds[Id];
        // get clauses
        pCubes = Vec_IntEntryP( vCnfs, Vec_IntEntry(vCnfs, iFunc) );
        nCubes = *pCubes++;
        for ( c = 0; c < nCubes; c++ )
        {
            pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
            k = Mf_CutSize(pCut);
            assert( Mf_CubeLit(pCubes[c], k) );
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], (Mf_CubeLit(pCubes[c], k) == 2) ^ fComplLast );
            for ( k = 0; k < Mf_CutSize(pCut); k++ )
                if ( Mf_CubeLit(pCubes[c], k) )
                    pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], Mf_CubeLit(pCubes[c], k) == 2 );
        }
    }
    // constant clause
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[0], 1);
    assert( iCla == nClas );
    assert( iLit == nLits );
    // add closing pointer
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    // cleanup
    Vec_IntFree( vCnfs );
    // create mapping of objects into their clauses
    if ( fCnfObjIds )
    {
        pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        for ( i = 0; i < pCnf->nClauses; i++ )
        {
            Id = Abc_Lit2Var(pCnf->pClauses[i][0]);
            if ( pCnf->pObj2Clause[Id] == -1 )
            {
                pCnf->pObj2Clause[Id] = i;
                pCnf->pObj2Count[Id] = 1;
            }
            else
            {
                assert( pCnf->pObj2Count[Id] > 0 );
                pCnf->pObj2Count[Id]++;
            }
        }
    }
    else
    {
        if ( p->pGia != p->pGia0 ) // diff managers - create map for CIs/COs
        {
            pCnf->pVarNums = ABC_FALLOC( int, Gia_ManObjNum(p->pGia0) );
            Gia_ManForEachCiId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCiIdToId(p->pGia, i)];
            Gia_ManForEachCoId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCoIdToId(p->pGia, i)];
/*
            // transform polarity of the internal nodes
            Gia_ManSetPhase( p->pGia );
            Gia_ManForEachCo( p->pGia, pObj, i )
                pObj->fPhase = 0;
            for ( i = 0; i < pCnf->nLiterals; i++ )
                if ( Gia_ManObj(p->pGia, Abc_Lit2Var(pCnf->pClauses[0][i]))->fPhase )
                    pCnf->pClauses[0][i] = Abc_LitNot( pCnf->pClauses[0][i] );
*/
        }
        else
            pCnf->pVarNums = Vec_IntReleaseArray(vCnfIds);
    }
    Vec_IntFree( vCnfIds );
    return pCnf;
}